

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  uint in_EDX;
  ImVec2 *in_RSI;
  ImDrawList *in_RDI;
  float fVar1;
  float fVar2;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar **in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float fVar3;
  float local_64;
  ImGuiCol in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffac;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 local_38;
  ImGuiWindow *local_30;
  ImGuiContext *pIVar4;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  local_30 = GImGui->CurrentWindow;
  if ((local_30->SkipItems & 1U) == 0) {
    pIVar4 = GImGui;
    if ((in_EDX & 0x100000) == 0) {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (uint *)in_stack_ffffffffffffff88);
    }
    ImVector<ImGuiTabBar_*>::push_back
              ((ImVector<ImGuiTabBar_*> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    if ((in_RDI->VtxBuffer).Size == pIVar4->FrameCount) {
      local_1 = true;
    }
    else {
      if (((((in_EDX & 1) != 0) && ((*(uint *)&in_RDI->field_0x4c & 1) == 0)) &&
          (1 < (in_RDI->CmdBuffer).Size)) && ((in_RDI->VtxBuffer).Capacity != -1)) {
        qsort((in_RDI->CmdBuffer).Data,(long)(in_RDI->CmdBuffer).Size,0x1c,
              TabItemComparerByVisibleOffset);
      }
      if ((in_EDX & 0xc0) == 0) {
        in_EDX = in_EDX | 0x40;
      }
      *(uint *)&in_RDI->field_0x4c = in_EDX;
      (in_RDI->VtxBuffer).Data = (ImDrawVert *)*in_RSI;
      fVar2 = in_RSI[1].y;
      in_RDI->Flags = (ImDrawListFlags)in_RSI[1].x;
      *(float *)&in_RDI->field_0x34 = fVar2;
      *(undefined1 *)&in_RDI->_IdxWritePtr = 1;
      (in_RDI->VtxBuffer).Capacity = (in_RDI->VtxBuffer).Size;
      (in_RDI->VtxBuffer).Size = pIVar4->FrameCount;
      fVar2 = *(float *)((long)&in_RDI->_Data + 4);
      fVar1 = ImRect::GetHeight((ImRect *)&(in_RDI->VtxBuffer).Data);
      ImVec2::ImVec2(&local_38,fVar2,fVar1);
      ItemSize((ImVec2 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      (local_30->DC).CursorPos.x = *(float *)&(in_RDI->VtxBuffer).Data;
      GetColorU32(in_stack_ffffffffffffffa4,fVar2);
      fVar2 = *(float *)&in_RDI->field_0x34 - 1.0;
      if ((in_EDX & 0x200000) == 0) {
        local_64 = (local_30->WindowPadding).x;
      }
      else {
        local_64 = 0.0;
      }
      fVar1 = (float)in_RDI->Flags;
      if ((in_EDX & 0x200000) == 0) {
        fVar3 = (local_30->WindowPadding).x;
      }
      else {
        fVar3 = 0.0;
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,
                     *(float *)&(in_RDI->VtxBuffer).Data - local_64,fVar2);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,fVar1 + fVar3,fVar2);
      ImDrawList::AddLine(in_RDI,in_RSI,(ImVec2 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                          (ImU32)((ulong)pIVar4 >> 0x20),SUB84(pIVar4,0));
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        window->IDStack.push_back(tab_bar->ID);

    g.CurrentTabBar.push_back(tab_bar);
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order. 
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;

    // Layout    
    ItemSize(ImVec2(tab_bar->OffsetMax, tab_bar->BarRect.GetHeight()));
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_Tab);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - ((flags & ImGuiTabBarFlags_DockNodeIsDockSpace) ? 0.0f : window->WindowPadding.x);
        const float separator_max_x = tab_bar->BarRect.Max.x + ((flags & ImGuiTabBarFlags_DockNodeIsDockSpace) ? 0.0f : window->WindowPadding.x);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}